

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeNVE.cpp
# Opt level: O0

void __thiscall OpenMD::FluctuatingChargeNVE::moveB(FluctuatingChargeNVE *this)

{
  SimInfo *this_00;
  long in_RDI;
  RealType RVar1;
  StuntDouble *this_01;
  RealType cmass;
  RealType cvel;
  RealType cfrc;
  Atom *atom;
  Molecule *mol;
  FluctuatingChargeIterator j;
  MoleculeIterator i;
  StuntDouble *in_stack_ffffffffffffffc0;
  Atom *in_stack_ffffffffffffffd8;
  SimInfo *in_stack_ffffffffffffffe0;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_18;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_10 [2];
  
  if ((*(byte *)(in_RDI + 0x28) & 1) != 0) {
    std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(local_10);
    __gnu_cxx::
    __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
    ::__normal_iterator(&local_18);
    for (this_00 = (SimInfo *)
                   SimInfo::beginMolecule
                             (in_stack_ffffffffffffffe0,
                              (MoleculeIterator *)in_stack_ffffffffffffffd8);
        this_00 != (SimInfo *)0x0;
        this_00 = (SimInfo *)SimInfo::nextMolecule(this_00,(MoleculeIterator *)0x0)) {
      for (in_stack_ffffffffffffffd8 =
                Molecule::beginFluctuatingCharge
                          ((Molecule *)this_00,(iterator *)in_stack_ffffffffffffffd8);
          in_stack_ffffffffffffffd8 != (Atom *)0x0;
          in_stack_ffffffffffffffd8 =
               Molecule::nextFluctuatingCharge
                         ((Molecule *)this_00,(iterator *)in_stack_ffffffffffffffd8)) {
        RVar1 = StuntDouble::getFlucQVel(in_stack_ffffffffffffffc0);
        this_01 = (StuntDouble *)StuntDouble::getFlucQFrc(in_stack_ffffffffffffffc0);
        in_stack_ffffffffffffffc0 = (StuntDouble *)Atom::getChargeMass(in_stack_ffffffffffffffd8);
        StuntDouble::setFlucQVel
                  (this_01,(*(double *)(in_RDI + 0x30) * (double)this_01) /
                           (double)in_stack_ffffffffffffffc0 + RVar1);
      }
    }
  }
  return;
}

Assistant:

void FluctuatingChargeNVE::moveB() {
    if (!hasFlucQ_) return;
    SimInfo::MoleculeIterator i;
    Molecule::FluctuatingChargeIterator j;
    Molecule* mol;
    Atom* atom;
    RealType cfrc, cvel, cmass;

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
           atom = mol->nextFluctuatingCharge(j)) {
        cvel  = atom->getFlucQVel();
        cfrc  = atom->getFlucQFrc();
        cmass = atom->getChargeMass();

        // velocity half step
        cvel += dt2_ * cfrc / cmass;
        atom->setFlucQVel(cvel);
      }
    }
  }